

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O0

int Fra_Claus(Aig_Man_t *pAig,int nFrames,int nPref,int nClausesMax,int nLutSize,int nLevels,
             int nCutsMax,int nBatches,int fStepUp,int fBmc,int fRefs,int fTarget,int fVerbose,
             int fVeryVerbose)

{
  Aig_Man_t *p_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  abctime aVar4;
  Clu_Man_t *p_01;
  Cnf_Dat_t *pCVar5;
  sat_solver *psVar6;
  abctime aVar7;
  abctime aVar8;
  char *pcVar9;
  int nClausesBeg;
  int nPrefOld;
  int Counter;
  int Iter;
  int b;
  abctime clkInd;
  abctime clkTotal;
  abctime clk;
  Clu_Man_t *p;
  int nLevels_local;
  int nLutSize_local;
  int nClausesMax_local;
  int nPref_local;
  int nFrames_local;
  Aig_Man_t *pAig_local;
  
  aVar4 = Abc_Clock();
  p_01 = Fra_ClausAlloc(pAig,nFrames,nPref,nClausesMax,nLutSize,nLevels,nCutsMax,nBatches,fStepUp,
                        fTarget,fVerbose,fVeryVerbose);
  if (p_01->fVerbose != 0) {
    printf("PARAMETERS: Frames = %d. Pref = %d. Clauses max = %d. Cut size = %d.\n",
           (ulong)(uint)nFrames,(ulong)(uint)nPref,(ulong)(uint)nClausesMax,(ulong)(uint)nLutSize);
    pcVar9 = "no";
    if (fStepUp != 0) {
      pcVar9 = "yes";
    }
    printf("Level max = %d. Cuts max = %d. Batches = %d. Increment cut size = %s.\n",
           (ulong)(uint)nLevels,(ulong)(uint)nCutsMax,(ulong)(uint)nBatches,pcVar9);
  }
  if (p_01->fTarget != 0) {
    iVar1 = Aig_ManCoNum(pAig);
    iVar2 = Aig_ManRegNum(pAig);
    if (iVar1 - iVar2 != 1) {
      __assert_fail("!p->fTarget || Aig_ManCoNum(pAig) - Aig_ManRegNum(pAig) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClaus.c"
                    ,0x6a2,
                    "int Fra_Claus(Aig_Man_t *, int, int, int, int, int, int, int, int, int, int, int, int, int)"
                   );
    }
  }
  Abc_Clock();
  p_00 = p_01->pAig;
  iVar1 = Aig_ManCoNum(p_01->pAig);
  pCVar5 = Cnf_DeriveSimple(p_00,iVar1);
  p_01->pCnf = pCVar5;
  Abc_Clock();
  psVar6 = (sat_solver *)Cnf_DataWriteIntoSolver(p_01->pCnf,p_01->nPref + p_01->nFrames,1);
  p_01->pSatBmc = psVar6;
  if (p_01->pSatBmc == (sat_solver *)0x0) {
    printf("Error: BMC solver is unsat.\n");
    Fra_ClausFree(p_01);
  }
  else if ((p_01->fTarget == 0) || (iVar1 = Fra_ClausRunBmc(p_01), iVar1 != 0)) {
    Abc_Clock();
    psVar6 = (sat_solver *)Cnf_DataWriteIntoSolver(p_01->pCnf,p_01->nFrames + 1,0);
    p_01->pSatMain = psVar6;
    if (p_01->pSatMain == (sat_solver *)0x0) {
      printf("Error: Main solver is unsat.\n");
      Fra_ClausFree(p_01);
    }
    else {
      for (Counter = 0; Counter < p_01->nBatches; Counter = Counter + 1) {
        printf("*** BATCH %d:  ",(ulong)(Counter + 1));
        if (((Counter != 0) && (p_01->nLutSize < 0xc)) &&
           ((p_01->fFiltering == 0 || ((p_01->fNothingNew != 0 || (p_01->fStepUp != 0)))))) {
          p_01->nLutSize = p_01->nLutSize + 1;
        }
        printf("Using %d-cuts.\n",(ulong)(uint)p_01->nLutSize);
        if ((p_01->fTarget != 0) && (iVar1 = Fra_ClausRunSat(p_01), iVar1 != 0)) {
          printf("Problem is inductive without strengthening.\n");
          Fra_ClausFree(p_01);
          return 1;
        }
        Abc_Clock();
        iVar1 = p_01->nPref;
        p_01->nPref = 0;
        p_01->nSimWordsPref = 0;
        Fra_ClausProcessClauses2(p_01,fRefs);
        p_01->nPref = iVar1;
        p_01->nSimWordsPref = (p_01->nPref * p_01->nSimWords) / p_01->nSimFrames;
        if (fBmc != 0) {
          aVar7 = Abc_Clock();
          uVar3 = Fra_ClausBmcClauses(p_01);
          p_01->nClauses = p_01->nClauses - uVar3;
          if (fVerbose != 0) {
            printf("BMC disproved %d clauses.  ",(ulong)uVar3);
            Abc_Print(1,"%s =","Time");
            aVar8 = Abc_Clock();
            Abc_Print(1,"%9.2f sec\n",((double)(aVar8 - aVar7) * 1.0) / 1000000.0);
          }
        }
        clkTotal = Abc_Clock();
        nClausesBeg = 1;
        nPrefOld = 0;
        while (0 < nClausesBeg) {
          if (fVerbose != 0) {
            printf("Iter %3d : Begin = %5d. ",(ulong)(uint)nPrefOld,(ulong)(uint)p_01->nClauses);
          }
          nClausesBeg = Fra_ClausInductiveClauses(p_01);
          if (0 < nClausesBeg) {
            p_01->nClauses = p_01->nClauses - nClausesBeg;
          }
          if (fVerbose != 0) {
            printf("End = %5d. Exs = %5d.  ",(ulong)(uint)p_01->nClauses,(ulong)(uint)p_01->nCexes);
            Abc_Print(1,"%s =","Time");
            aVar7 = Abc_Clock();
            Abc_Print(1,"%9.2f sec\n",((double)(aVar7 - clkTotal) * 1.0) / 1000000.0);
          }
          clkTotal = Abc_Clock();
          nPrefOld = nPrefOld + 1;
        }
        Fra_ClausAddToStorage(p_01);
        if (p_01->fTarget == 0) {
          printf("Finished proving inductive clauses. ");
          Abc_Print(1,"%s =","Time  ");
          aVar7 = Abc_Clock();
          Abc_Print(1,"%9.2f sec\n",((double)(aVar7 - aVar4) * 1.0) / 1000000.0);
        }
        else {
          if (nClausesBeg == -1) {
            printf("Fra_Claus(): Internal error.  ");
          }
          else if (p_01->fFail == 0) {
            printf("Property HOLDS inductively after strengthening.  ");
          }
          else {
            printf("Property FAILS during refinement.  ");
          }
          Abc_Print(1,"%s =","Time  ");
          aVar7 = Abc_Clock();
          Abc_Print(1,"%9.2f sec\n",((double)(aVar7 - aVar4) * 1.0) / 1000000.0);
          if (p_01->fFail == 0) break;
        }
      }
      Fra_InvariantVerify(pAig,nFrames,p_01->vClausesProven,p_01->vLitsProven);
      if (p_01->fVerbose != 0) {
        Fra_ClausPrintIndClauses(p_01);
        Fra_ClausEstimateCoverage(p_01);
      }
      if (p_01->fTarget == 0) {
        Fra_ClausWriteIndClauses(p_01);
      }
      Fra_ClausFree(p_01);
    }
  }
  else {
    printf("Problem fails the base case after %d frame expansion.\n",
           (ulong)(uint)(p_01->nPref + p_01->nFrames));
    Fra_ClausFree(p_01);
  }
  return 1;
}

Assistant:

int Fra_Claus( Aig_Man_t * pAig, int nFrames, int nPref, int nClausesMax, int nLutSize, int nLevels, int nCutsMax, int nBatches, int fStepUp, int fBmc, int fRefs, int fTarget, int fVerbose, int fVeryVerbose )
{
    Clu_Man_t * p;
    abctime clk, clkTotal = Abc_Clock(), clkInd;
    int b, Iter, Counter, nPrefOld;
    int nClausesBeg = 0;

    // create the manager
    p = Fra_ClausAlloc( pAig, nFrames, nPref, nClausesMax, nLutSize, nLevels, nCutsMax, nBatches, fStepUp, fTarget, fVerbose, fVeryVerbose );
if ( p->fVerbose )
{
    printf( "PARAMETERS: Frames = %d. Pref = %d. Clauses max = %d. Cut size = %d.\n", nFrames, nPref, nClausesMax, nLutSize );
    printf( "Level max = %d. Cuts max = %d. Batches = %d. Increment cut size = %s.\n", nLevels, nCutsMax, nBatches, fStepUp? "yes":"no" );
//ABC_PRT( "Sim-seq", Abc_Clock() - clk );
}

    assert( !p->fTarget || Aig_ManCoNum(pAig) - Aig_ManRegNum(pAig) == 1 );

clk = Abc_Clock();
    // derive CNF
//    if ( p->fTarget )
//        p->pAig->nRegs++;
    p->pCnf = Cnf_DeriveSimple( p->pAig, Aig_ManCoNum(p->pAig) );
//    if ( p->fTarget )
//        p->pAig->nRegs--;
if ( fVerbose )
{
//ABC_PRT( "CNF    ", Abc_Clock() - clk );
}

    // check BMC
clk = Abc_Clock();
    p->pSatBmc = (sat_solver *)Cnf_DataWriteIntoSolver( p->pCnf, p->nPref + p->nFrames, 1 );
    if ( p->pSatBmc == NULL )
    {
        printf( "Error: BMC solver is unsat.\n" );
        Fra_ClausFree( p );
        return 1;
    } 
    if ( p->fTarget && !Fra_ClausRunBmc( p ) )
    {
        printf( "Problem fails the base case after %d frame expansion.\n", p->nPref + p->nFrames );
        Fra_ClausFree( p );
        return 1;
    }
if ( fVerbose )
{
//ABC_PRT( "SAT-bmc", Abc_Clock() - clk );
}

    // start the SAT solver
clk = Abc_Clock();
    p->pSatMain = (sat_solver *)Cnf_DataWriteIntoSolver( p->pCnf, p->nFrames+1, 0 );
    if ( p->pSatMain == NULL )
    {
        printf( "Error: Main solver is unsat.\n" );
        Fra_ClausFree( p );
        return 1;
    } 


    for ( b = 0; b < p->nBatches; b++ )
    {
//        if ( fVerbose )
        printf( "*** BATCH %d:  ", b+1 );
        if ( b && p->nLutSize < 12 && (!p->fFiltering || p->fNothingNew || p->fStepUp) )
            p->nLutSize++;
        printf( "Using %d-cuts.\n", p->nLutSize );

        // try solving without additional clauses
        if ( p->fTarget && Fra_ClausRunSat( p ) )
        {
            printf( "Problem is inductive without strengthening.\n" );
            Fra_ClausFree( p );
            return 1;
        }
        if ( fVerbose )
        {
//        ABC_PRT( "SAT-ind", Abc_Clock() - clk );
        }
 
        // collect the candidate inductive clauses using 4-cuts
        clk = Abc_Clock();
        nPrefOld = p->nPref; p->nPref = 0; p->nSimWordsPref = 0;
    //    Fra_ClausProcessClauses( p, fRefs );
        Fra_ClausProcessClauses2( p, fRefs );
        p->nPref = nPrefOld;
        p->nSimWordsPref = p->nPref*p->nSimWords/p->nSimFrames;
        nClausesBeg = p->nClauses;

    //ABC_PRT( "Clauses", Abc_Clock() - clk );


        // check clauses using BMC
        if ( fBmc ) 
        {
            clk = Abc_Clock();
            Counter = Fra_ClausBmcClauses( p );
            p->nClauses -= Counter;
            if ( fVerbose )
            {
                printf( "BMC disproved %d clauses.  ", Counter );
                ABC_PRT( "Time", Abc_Clock() - clk );
            }
        }


        // prove clauses inductively
        clkInd = clk = Abc_Clock();
        Counter = 1;
        for ( Iter = 0; Counter > 0; Iter++ )
        {
            if ( fVerbose )
            printf( "Iter %3d : Begin = %5d. ", Iter, p->nClauses );
            Counter = Fra_ClausInductiveClauses( p );
            if ( Counter > 0 )
               p->nClauses -= Counter;
            if ( fVerbose )
            {
            printf( "End = %5d. Exs = %5d.  ", p->nClauses, p->nCexes );
    //        printf( "\n" );
            ABC_PRT( "Time", Abc_Clock() - clk );
            }
            clk = Abc_Clock();
        }
        // add proved clauses to storage
        Fra_ClausAddToStorage( p );
        // report the results
        if ( p->fTarget )
        {
            if ( Counter == -1 )
                printf( "Fra_Claus(): Internal error.  " );
            else if ( p->fFail )
                printf( "Property FAILS during refinement.  " );
            else
                printf( "Property HOLDS inductively after strengthening.  " );
            ABC_PRT( "Time  ", Abc_Clock() - clkTotal );
            if ( !p->fFail )
                break;
        }
        else
        {
            printf( "Finished proving inductive clauses. " );
            ABC_PRT( "Time  ", Abc_Clock() - clkTotal );
        }
    }

    // verify the computed interpolant
    Fra_InvariantVerify( pAig, nFrames, p->vClausesProven, p->vLitsProven );
//    printf( "THIS COMMAND IS KNOWN TO HAVE A BUG!\n" );

//    if ( !p->fTarget && p->fVerbose )
    if ( p->fVerbose )
    {
        Fra_ClausPrintIndClauses( p );
        Fra_ClausEstimateCoverage( p );
    }

    if ( !p->fTarget )
    {
        Fra_ClausWriteIndClauses( p );
    }
/*
    // print the statistic into a file
    {
        FILE * pTable;
        assert( p->nBatches == 1 );
        pTable = fopen( "stats.txt", "a+" );
        fprintf( pTable, "%s ",  pAig->pName );
        fprintf( pTable, "%d ",  Aig_ManCiNum(pAig)-Aig_ManRegNum(pAig) );
        fprintf( pTable, "%d ",  Aig_ManCoNum(pAig)-Aig_ManRegNum(pAig) );
        fprintf( pTable, "%d ",  Aig_ManRegNum(pAig) );
        fprintf( pTable, "%d ",  Aig_ManNodeNum(pAig) );
        fprintf( pTable, "%d ",  p->nCuts );
        fprintf( pTable, "%d ",  nClausesBeg );
        fprintf( pTable, "%d ",  p->nClauses );
        fprintf( pTable, "%d ",  Iter );
        fprintf( pTable, "%.2f ", (float)(clkInd-clkTotal)/(float)(CLOCKS_PER_SEC) );
        fprintf( pTable, "%.2f ", (float)(Abc_Clock()-clkInd)/(float)(CLOCKS_PER_SEC) );
        fprintf( pTable, "%.2f ", (float)(Abc_Clock()-clkTotal)/(float)(CLOCKS_PER_SEC) );
        fprintf( pTable, "\n" );
        fclose( pTable );
    }
*/
    // clean the manager
    Fra_ClausFree( p );
    return 1;
}